

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
QLearning::IndexFromMulti
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,QLearning *this,
          int one_dimensional_index,int nn,int depth)

{
  pointer piVar1;
  uint in_EAX;
  ulong uVar2;
  ulong uVar3;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)depth,(value_type *)((long)&uStack_28 + 4),
             (allocator_type *)((long)&uStack_28 + 3));
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = 0;
  uVar3 = (ulong)(uint)depth;
  if (depth < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    piVar1[uVar2] = one_dimensional_index % nn;
    one_dimensional_index = one_dimensional_index / nn;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> QLearning::IndexFromMulti(int one_dimensional_index, int nn, int depth)
{
    std::vector<int> index(depth, 0);
    for (int i = 0; i < depth; i++)
    {
        index[i] = (one_dimensional_index % nn);
        one_dimensional_index /= nn;
    }
    return index;
}